

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O0

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,3ul>>
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b,double t)

{
  unsigned_long *puVar1;
  double3 *pdVar2;
  double3 *b_00;
  tinyusdz *this_00;
  const_reference a_00;
  reference pvVar3;
  double3 local_70;
  ulong local_58;
  size_t i;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  size_t n;
  double local_28;
  double t_local;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b_local;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a_local;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *dst;
  
  n._7_1_ = 0;
  local_28 = t;
  t_local = (double)a;
  b_local = (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)this;
  a_local = __return_storage_ptr__;
  ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (__return_storage_ptr__);
  local_40 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                       (b_local);
  local_48 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                       ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                         *)t_local);
  puVar1 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar1;
  if (local_38 != 0) {
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
              (__return_storage_ptr__,local_38);
    pdVar2 = (double3 *)
             ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                       (b_local);
    b_00 = (double3 *)
           ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::size
                     ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                      t_local);
    if (pdVar2 == b_00) {
      for (local_58 = 0; local_58 < local_38; local_58 = local_58 + 1) {
        this_00 = (tinyusdz *)
                  ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ::operator[](b_local,local_58);
        a_00 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
               operator[]((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                           *)t_local,local_58);
        lerp<std::array<double,3ul>>(&local_70,this_00,a_00,b_00,local_28);
        pvVar3 = ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                 operator[](__return_storage_ptr__,local_58);
        pvVar3->_M_elems[0] = local_70._M_elems[0];
        pvVar3->_M_elems[1] = local_70._M_elems[1];
        pvVar3->_M_elems[2] = local_70._M_elems[2];
        b_00 = (double3 *)local_70._M_elems[2];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}